

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# comex.c
# Opt level: O0

void comex_make_progress(void)

{
  int iVar1;
  header_t *header_00;
  bool bVar2;
  MPI_Status recv_status;
  header_t *header;
  char *payload;
  char *message;
  int length;
  int lock_flag;
  int get_flag;
  MPI_Status iprobe_status;
  int iprobe_flag;
  char *payload_00;
  undefined4 in_stack_ffffffffffffff80;
  undefined3 uVar3;
  int in_stack_ffffffffffffff84;
  char *payload_01;
  char local_60 [24];
  header_t *local_48;
  header_t *local_40;
  header_t *local_38;
  undefined4 local_2c;
  int local_28;
  int local_24;
  int local_20 [7];
  int local_4;
  
  local_28 = 0;
  do {
    local_4 = 0;
    local_24 = 0;
    if (l_state.mq_head != (message_t *)0x0) {
      while( true ) {
        bVar2 = false;
        if (l_state.mq_head != (message_t *)0x0) {
          iVar1 = _mq_test();
          bVar2 = iVar1 != 0;
        }
        if (!bVar2) break;
        _mq_pop();
      }
    }
    iVar1 = _gq_test();
    if (iVar1 != 0) {
      local_24 = 1;
    }
    MPI_Iprobe(0xffffffff,0x6be8,l_state.world_comm,&local_4,local_20);
    if (local_4 != 0) {
      payload_01 = &ompi_mpi_char;
      MPI_Get_count(local_20,&ompi_mpi_char,&local_2c);
      local_38 = (header_t *)
                 _my_malloc(CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
      payload_00 = local_60;
      MPI_Recv(local_38,local_2c,payload_01,local_20[0],0x6be8,l_state.world_comm);
      local_48 = local_38;
      local_40 = local_38 + 1;
      header_00 = (header_t *)(ulong)local_38->operation;
      iVar1 = (int)((ulong)payload_00 >> 0x20);
      switch(header_00) {
      case (header_t *)0x0:
        _put_handler((header_t *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                     payload_00);
        break;
      case (header_t *)0x1:
        _get_request_handler
                  ((header_t *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),iVar1);
        break;
      case (header_t *)0x2:
        _get_response_handler
                  ((header_t *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                   payload_00);
        break;
      case (header_t *)0x3:
      case (header_t *)0x4:
      case (header_t *)0x5:
      case (header_t *)0x6:
      case (header_t *)0x7:
      case (header_t *)0x8:
        _acc_handler(header_00,payload_01);
        break;
      case (header_t *)0x9:
        _fence_request_handler
                  ((header_t *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),iVar1);
        break;
      case (header_t *)0xa:
        _fence_response_handler
                  ((header_t *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),iVar1);
        break;
      case (header_t *)0xb:
        _barrier_request_handler
                  ((header_t *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),iVar1);
        break;
      case (header_t *)0xc:
        _barrier_response_handler(local_38,local_20[0]);
        break;
      case (header_t *)0xd:
        _fetch_and_add_request_handler(header_00,payload_01,in_stack_ffffffffffffff84);
        break;
      case (header_t *)0xe:
        _fetch_and_add_response_handler
                  ((header_t *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                   payload_00);
        break;
      case (header_t *)0xf:
        _swap_request_handler(header_00,payload_01,in_stack_ffffffffffffff84);
        break;
      case (header_t *)0x10:
        _swap_response_handler
                  ((header_t *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                   payload_00);
        break;
      case (header_t *)0x11:
        _lock_request_handler
                  ((header_t *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),iVar1);
        break;
      case (header_t *)0x12:
        _lock_response_handler(local_38);
        break;
      case (header_t *)0x13:
        _unlock_request_handler
                  ((header_t *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),iVar1);
        break;
      default:
        printf("[%d] header operation not recognized: %d\n",(ulong)(uint)l_state.rank,
               (ulong)local_38->operation);
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/GlobalArrays[P]ga/comex/src-mpi/comex.c"
                      ,0x1a0,"void comex_make_progress(void)");
      }
      _my_free((void *)0x10d0d1);
    }
    local_28 = _lq_progress();
    uVar3 = (undefined3)in_stack_ffffffffffffff84;
    in_stack_ffffffffffffff84 = CONCAT13(1,uVar3);
    if ((local_4 == 0) && (in_stack_ffffffffffffff84 = CONCAT13(1,uVar3), local_24 == 0)) {
      in_stack_ffffffffffffff84 = CONCAT13(l_state.mq_size != 0,uVar3);
    }
  } while ((char)((uint)in_stack_ffffffffffffff84 >> 0x18) != '\0');
  return;
}

Assistant:

void comex_make_progress(void)
{
    int iprobe_flag=0;
    MPI_Status iprobe_status;
    int get_flag=0;
    int lock_flag=0;

#if DEBUG
    printf("[%d] comex_make_progress()\n", l_state.rank);
#endif

    do {
        iprobe_flag = 0;
        get_flag = 0;

        /* test for outgoing message completion only if we have outgoing
         * messages; we test from the head only */
        if (l_state.mq_head) {
            while (l_state.mq_head && _mq_test()) {
                _mq_pop();
            }
        }

        /* test for incoming get responses */
        if (_gq_test()) {
            get_flag = 1;
        }

        /* test for incoming messages */
        MPI_Iprobe(MPI_ANY_SOURCE, COMEX_TAG, l_state.world_comm,
                &iprobe_flag, &iprobe_status);
        if (iprobe_flag) {
            int length;
            char *message;
            char *payload;
            header_t *header;
            MPI_Status recv_status;

            /* allocate message buffer and get message */
            MPI_Get_count(&iprobe_status, MPI_CHAR, &length);
#if DEBUG
            printf("[%d] iprobe source=%d length=%d\n",
                    l_state.rank, iprobe_status.MPI_SOURCE, length);
#endif

            message = _my_malloc(length);
            MPI_Recv(message, length, MPI_CHAR,
                    iprobe_status.MPI_SOURCE, COMEX_TAG,
                    l_state.world_comm, &recv_status);
            header = (header_t*)message;
            payload = message + sizeof(header_t);
            /* dispatch message handler */
            switch (header->operation) {
                case OP_PUT:
                    _put_handler(header, payload);
                    break;
                case OP_GET_REQUEST:
                    _get_request_handler(header, iprobe_status.MPI_SOURCE);
                    break;
                case OP_GET_RESPONSE:
                    _get_response_handler(header, payload);
                    break;
                case OP_ACC_INT:
                case OP_ACC_DBL:
                case OP_ACC_FLT:
                case OP_ACC_CPL:
                case OP_ACC_DCP:
                case OP_ACC_LNG:
                    _acc_handler(header, payload);
                    break;
                case OP_FENCE_REQUEST:
                    _fence_request_handler(header, iprobe_status.MPI_SOURCE);
                    break;
                case OP_FENCE_RESPONSE:
                    _fence_response_handler(header, iprobe_status.MPI_SOURCE);
                    break;
                case OP_BARRIER_REQUEST:
                    _barrier_request_handler(header, iprobe_status.MPI_SOURCE);
                    break;
                case OP_BARRIER_RESPONSE:
                    _barrier_response_handler(header, iprobe_status.MPI_SOURCE);
                    break;
                case OP_FETCH_AND_ADD_REQUEST:
                    _fetch_and_add_request_handler(header, payload,
                            iprobe_status.MPI_SOURCE);
                    break;
                case OP_FETCH_AND_ADD_RESPONSE:
                    _fetch_and_add_response_handler(header, payload);
                    break;
                case OP_SWAP_REQUEST:
                    _swap_request_handler(header, payload,
                            iprobe_status.MPI_SOURCE);
                    break;
                case OP_SWAP_RESPONSE:
                    _swap_response_handler(header, payload);
                    break;
                case OP_LOCK_REQUEST:
                    _lock_request_handler(header, iprobe_status.MPI_SOURCE);
                    break;
                case OP_LOCK_RESPONSE:
                    _lock_response_handler(header);
                    break;
                case OP_UNLOCK:
                    _unlock_request_handler(header, iprobe_status.MPI_SOURCE);
                    break;
                default:
                    printf("[%d] header operation not recognized: %d\n",
                            l_state.rank, header->operation);
                    assert(0);
            }

            /* free the message buffer */
            _my_free(message);
        }

        lock_flag = _lq_progress();

        /* loop until we run out of incoming and outgoing messages */
#if DEBUG
        printf("[%d] iprobe_flag=%d || get_flag=%d || l_state.mq_size=%d lock_flag=%d\n",
                l_state.rank, iprobe_flag, get_flag, l_state.mq_size, lock_flag);
#endif
    } while (iprobe_flag || get_flag || l_state.mq_size);
}